

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_location.hpp
# Opt level: O0

int __thiscall
jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>::compare
          (basic_path_element<char,_std::allocator<char>_> *this,
          basic_path_element<char,_std::allocator<char>_> *other)

{
  byte *in_RSI;
  byte *in_RDI;
  int diff;
  uint local_14;
  
  if ((*in_RDI & 1) == (*in_RSI & 1)) {
    if ((*in_RDI & 1) == 0) {
      if (*(ulong *)(in_RDI + 0x28) < *(ulong *)(in_RSI + 0x28)) {
        local_14 = 0xffffffff;
      }
      else {
        local_14 = (uint)(*(ulong *)(in_RSI + 0x28) < *(ulong *)(in_RDI + 0x28));
      }
    }
    else {
      local_14 = std::__cxx11::string::compare((string *)(in_RDI + 8));
    }
  }
  else {
    local_14 = (uint)(*in_RDI & 1) - (uint)(*in_RSI & 1);
  }
  return local_14;
}

Assistant:

int compare(const basic_path_element& other) const
        {
            int diff = 0;
            if (has_name_ != other.has_name_)
            {
                diff = static_cast<int>(has_name_) - static_cast<int>(other.has_name_);
            }
            else
            {
                if (has_name_)
                {
                    diff = name_.compare(other.name_);
                }
                else if (index_ < other.index_)
                {
                    diff = -1;
                }
                else if (index_ > other.index_)
                {
                    diff = 1;
                }
                else
                {
                    diff = 0;
                }
            }
            return diff;
        }